

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

int testing::internal::GetNextRandomSeed(int seed)

{
  int iVar1;
  ostream *poVar2;
  GTestLog local_c;
  
  if (0x1869e < seed - 1U) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x99);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Condition 1 <= seed && seed <= kMaxRandomSeed failed. ");
    poVar2 = std::operator<<(poVar2,"Invalid random seed ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,seed);
    poVar2 = std::operator<<(poVar2," - must be in [1, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,99999);
    std::operator<<(poVar2,"].");
    GTestLog::~GTestLog(&local_c);
  }
  iVar1 = 1;
  if (seed < 99999) {
    iVar1 = seed + 1;
  }
  return iVar1;
}

Assistant:

inline int GetNextRandomSeed(int seed) {
  GTEST_CHECK_(1 <= seed && seed <= kMaxRandomSeed)
      << "Invalid random seed " << seed << " - must be in [1, "
      << kMaxRandomSeed << "].";
  const int next_seed = seed + 1;
  return (next_seed > kMaxRandomSeed) ? 1 : next_seed;
}